

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

altsvc * altsvc_create(Curl_str *srchost,Curl_str *dsthost,Curl_str *srcalpn,Curl_str *dstalpn,
                      size_t srcport,size_t dstport)

{
  alpnid dstalpnid;
  alpnid srcalpnid;
  altsvc *paVar1;
  size_t in_stack_00000008;
  
  dstalpnid = Curl_alpn2alpnid((char *)dstalpn,srcport);
  srcalpnid = Curl_alpn2alpnid(srcalpn->str,srcalpn->len);
  if (dstalpnid == ALPN_none || srcalpnid == ALPN_none) {
    paVar1 = (altsvc *)0x0;
  }
  else {
    paVar1 = altsvc_createid(srchost->str,srchost->len,dsthost->str,dsthost->len,srcalpnid,dstalpnid
                             ,dstport,in_stack_00000008);
  }
  return paVar1;
}

Assistant:

static struct altsvc *altsvc_create(struct Curl_str *srchost,
                                    struct Curl_str *dsthost,
                                    struct Curl_str *srcalpn,
                                    struct Curl_str *dstalpn,
                                    size_t srcport,
                                    size_t dstport)
{
  enum alpnid dstalpnid =
    Curl_alpn2alpnid(Curl_str(dstalpn), Curl_strlen(dstalpn));
  enum alpnid srcalpnid =
    Curl_alpn2alpnid(Curl_str(srcalpn), Curl_strlen(srcalpn));
  if(!srcalpnid || !dstalpnid)
    return NULL;
  return altsvc_createid(Curl_str(srchost), Curl_strlen(srchost),
                         Curl_str(dsthost), Curl_strlen(dsthost),
                         srcalpnid, dstalpnid,
                         srcport, dstport);
}